

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O2

int testIndexLotsaEntries(void)

{
  bool bVar1;
  int iVar2;
  VRDataIndex *this;
  ostream *poVar3;
  VRAnyCoreType VVar4;
  int iVar5;
  allocator<char> local_21d;
  int local_21c;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream name;
  ostream local_1a8 [376];
  
  local_21c = 0;
  bVar1 = true;
  while (bVar1) {
    this = setupIndex();
    for (iVar5 = 0; iVar5 != 1000; iVar5 = iVar5 + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&name);
      poVar3 = std::operator<<(local_1a8,"/henry/entry");
      std::ostream::operator<<(poVar3,iVar5);
      std::__cxx11::stringbuf::str();
      MinVR::VRDataIndex::addData(&local_1d8,this,&local_218,iVar5);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::stringstream::~stringstream((stringstream *)&name);
    }
    for (iVar5 = 0; iVar5 != 1000; iVar5 = iVar5 + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&name);
      poVar3 = std::operator<<(local_1a8,"/henry/entry");
      std::ostream::operator<<(poVar3,iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_21d);
      VVar4 = MinVR::VRDataIndex::getValue(this,&local_218,&local_1f8,true);
      iVar2 = (*(VVar4.datum)->_vptr_VRDatum[6])(VVar4.datum);
      local_21c = local_21c + (uint)(iVar5 != iVar2);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::stringstream::~stringstream((stringstream *)&name);
    }
    MinVR::VRDataIndex::~VRDataIndex(this);
    operator_delete(this,0x98);
    bVar1 = false;
  }
  return local_21c;
}

Assistant:

int testIndexLotsaEntries() {

  int out = 0;

  LOOP {

    MinVR::VRDataIndex *n = setupIndex();

    int lctr;
    int N = 1000;

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      n->addData(name.str(), lctr);
    }

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      out += ((lctr == (int)n->getValue(name.str())) ? 0 : 1);
    }

    delete n;
  }